

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.hpp
# Opt level: O1

void __thiscall LongReadsDatastore::~LongReadsDatastore(LongReadsDatastore *this)

{
  void *pvVar1;
  
  if (*(int *)(this + 8) != 0) {
    close(*(int *)(this + 8));
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)(this + 0x138));
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)(this + 0x120));
  std::
  _Hashtable<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<long,_long>_>,_std::hash<std::pair<long,_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::vector<SequenceDistanceGraphPath,_std::allocator<SequenceDistanceGraphPath>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<long,_long>_>,_std::hash<std::pair<long,_long>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(this + 0xe8));
  pvVar1 = *(void **)(this + 0xd0);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 0xe0) - (long)pvVar1);
  }
  pvVar1 = *(void **)(this + 0xb8);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 200) - (long)pvVar1);
  }
  if (*(LongReadsDatastore **)(this + 0x68) != this + 0x78) {
    operator_delete(*(LongReadsDatastore **)(this + 0x68),*(long *)(this + 0x78) + 1);
  }
  if (*(LongReadsDatastore **)(this + 0x48) != this + 0x58) {
    operator_delete(*(LongReadsDatastore **)(this + 0x48),*(long *)(this + 0x58) + 1);
  }
  if (*(LongReadsDatastore **)(this + 0x28) != this + 0x38) {
    operator_delete(*(LongReadsDatastore **)(this + 0x28),*(long *)(this + 0x38) + 1);
  }
  pvVar1 = *(void **)(this + 0x10);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 0x20) - (long)pvVar1);
    return;
  }
  return;
}

Assistant:

~LongReadsDatastore(){
        if (fd) {
            close(fd);
        }
    }